

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Image.c
# Opt level: O2

Vec_Ptr_t * Llb_NonlinCutNodes(Aig_Man_t *p,Vec_Ptr_t *vLower,Vec_Ptr_t *vUpper)

{
  void *pvVar1;
  Vec_Ptr_t *vNodes;
  Aig_Obj_t *pObj;
  int iVar2;
  
  Aig_ManIncrementTravId(p);
  for (iVar2 = 0; iVar2 < vLower->nSize; iVar2 = iVar2 + 1) {
    pvVar1 = Vec_PtrEntry(vLower,iVar2);
    *(int *)((long)pvVar1 + 0x20) = p->nTravIds;
  }
  vNodes = Vec_PtrAlloc(100);
  for (iVar2 = 0; iVar2 < vUpper->nSize; iVar2 = iVar2 + 1) {
    pObj = (Aig_Obj_t *)Vec_PtrEntry(vUpper,iVar2);
    Llb_NonlinCutNodes_rec(p,pObj,vNodes);
  }
  return vNodes;
}

Assistant:

Vec_Ptr_t * Llb_NonlinCutNodes( Aig_Man_t * p, Vec_Ptr_t * vLower, Vec_Ptr_t * vUpper )
{
    Vec_Ptr_t * vNodes;
    Aig_Obj_t * pObj;
    int i;
    // mark the lower cut with the traversal ID
    Aig_ManIncrementTravId(p);
    Vec_PtrForEachEntry( Aig_Obj_t *, vLower, pObj, i )
        Aig_ObjSetTravIdCurrent( p, pObj );
    // count the upper cut
    vNodes = Vec_PtrAlloc( 100 );
    Vec_PtrForEachEntry( Aig_Obj_t *, vUpper, pObj, i )
        Llb_NonlinCutNodes_rec( p, pObj, vNodes );
    return vNodes;
}